

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

iterator __thiscall
phmap::priv::
base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
::upper_bound(base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
              *this,key_type *key)

{
  iterator checker_iter;
  iterator iVar1;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  bVar2;
  iterator iVar3;
  key_type *key_local;
  base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  *this_local;
  
  iVar1 = btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
          ::upper_bound<int>((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                              *)this,key);
  checker_iter = std::multiset<int,_std::less<int>,_std::allocator<int>_>::upper_bound
                           (&this->checker_,key);
  bVar2._12_4_ = 0;
  bVar2.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                *)SUB128(iVar1._0_12_,0);
  bVar2.position = SUB124(iVar1._0_12_,8);
  bVar2 = base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
          ::
          iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>,std::_Rb_tree_const_iterator<int>>
                    ((base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
                      *)this,bVar2,(_Rb_tree_const_iterator<int>)checker_iter._M_node);
  iVar3._12_4_ = 0;
  iVar3.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                *)SUB128(bVar2._0_12_,0);
  iVar3.position = SUB124(bVar2._0_12_,8);
  return iVar3;
}

Assistant:

iterator upper_bound(const key_type &key) {
        return iter_check(tree_.upper_bound(key), checker_.upper_bound(key));
    }